

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O1

shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> __thiscall
async_simple::coro::detail::
LazyAwaiterBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
::awaitResume(LazyAwaiterBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
              *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> sVar4;
  
  psVar3 = LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
           ::result((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                     *)(*in_RSI + 0x10));
  peVar1 = (psVar3->
           super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (psVar3->
           super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (psVar3->
  super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  (psVar3->
  super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*in_RSI + 8))();
  *in_RSI = 0;
  (this->_handle).__handle_ = peVar1;
  this[1]._handle.__handle_ = p_Var2;
  sVar4.
  super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.
  super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>)
         sVar4.
         super___shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }